

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O0

vector<User,_std::allocator<User>_> * getUsers(void)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  reference pvVar4;
  vector<User,_std::allocator<User>_> *in_RDI;
  string local_2d8 [32];
  string local_2b8 [32];
  anon_struct_64_2_84df61a8 local_298;
  undefined4 local_250;
  int commaPos;
  istream local_240 [8];
  ifstream myfile;
  string local_30 [8];
  string line;
  vector<User,_std::allocator<User>_> *users;
  
  std::__cxx11::string::string(local_30);
  std::vector<User,_std::allocator<User>_>::vector(in_RDI);
  std::ifstream::ifstream(local_240,"../users.txt",_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cerr,"couldn\'t open file");
    exit(-1);
  }
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_240,local_30);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    local_250 = std::__cxx11::string::find((char *)local_30,0x118360);
    local_298._48_8_ = 0;
    local_298._56_8_ = 0;
    local_298.password = (string)0x0;
    local_298._33_7_ = 0;
    local_298._40_8_ = 0;
    local_298._16_8_ = 0;
    local_298._24_8_ = 0;
    local_298.username = (string)0x0;
    local_298._1_7_ = 0;
    local_298._8_8_ = 0;
    anon_struct_64_2_84df61a8::User(&local_298);
    std::vector<User,_std::allocator<User>_>::push_back(in_RDI,&local_298);
    anon_struct_64_2_84df61a8::~User(&local_298);
    std::__cxx11::string::substr((ulong)local_2b8,(ulong)local_30);
    pvVar4 = std::vector<User,_std::allocator<User>_>::back(in_RDI);
    std::__cxx11::string::operator=((string *)pvVar4,local_2b8);
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_2d8,(ulong)local_30);
    pvVar4 = std::vector<User,_std::allocator<User>_>::back(in_RDI);
    std::__cxx11::string::operator=((string *)&pvVar4->password,local_2d8);
    std::__cxx11::string::~string(local_2d8);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_240);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

vector<User> getUsers(){
    string line;
    vector<User> users;
    ifstream myfile ("../users.txt");

    if(myfile.is_open()){
        while(getline(myfile,line)){

            //get pos of comma
            int commaPos = line.find(",");

            users.push_back(User());
            //username if everything before comma and after (
            users.back().username = line.substr(1,commaPos-1);
            //password is evertyhign after the comma and space and before the )
            users.back().password = line.substr(commaPos+2,line.length() - commaPos - 3);
        }
        myfile.close();
    }
    else{
        cerr << "couldn't open file";
        exit(-1);
    }


    return users;
}